

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

size_t ZSTD_compressBlock_greedy_dictMatchState
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  int *ilimit_w;
  BYTE *iStart;
  int *iEnd;
  undefined8 *puVar1;
  uint uVar2;
  BYTE *pBVar3;
  ZSTD_matchState_t *pZVar4;
  int *piVar5;
  BYTE *pBVar6;
  seqDef *psVar7;
  undefined8 uVar8;
  bool bVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  size_t sVar13;
  ulong uVar14;
  int *mEnd;
  int *piVar15;
  int *piVar16;
  int *piVar17;
  BYTE *pBVar18;
  BYTE *pBVar19;
  long lVar20;
  BYTE *pBVar21;
  ulong uVar22;
  uint uVar23;
  size_t offsetFound;
  int *local_b8;
  int *local_a8;
  U32 local_9c;
  size_t local_50;
  uint *local_48;
  BYTE *local_40;
  ZSTD_matchState_t *local_38;
  
  pBVar3 = (ms->window).base;
  uVar2 = (ms->window).dictLimit;
  iStart = pBVar3 + uVar2;
  uVar12 = *rep;
  pZVar4 = ms->dictMatchState;
  piVar5 = (int *)(pZVar4->window).nextSrc;
  pBVar6 = (pZVar4->window).base;
  local_40 = pBVar6 + (pZVar4->window).dictLimit;
  uVar10 = ((int)src - ((int)local_40 + (int)iStart)) + (int)piVar5;
  local_38 = ms;
  if (uVar10 < uVar12) {
    __assert_fail("offset_1 <= dictAndPrefixLength",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x417a,
                  "size_t ZSTD_compressBlock_lazy_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const searchMethod_e, const U32, const ZSTD_dictMode_e)"
                 );
  }
  piVar16 = (int *)((long)src + (ulong)(uVar10 == 0));
  uVar23 = rep[1];
  local_48 = rep;
  if (uVar10 < uVar23) {
    __assert_fail("offset_2 <= dictAndPrefixLength",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x417b,
                  "size_t ZSTD_compressBlock_lazy_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const searchMethod_e, const U32, const ZSTD_dictMode_e)"
                 );
  }
  iEnd = (int *)((long)src + srcSize);
  piVar17 = (int *)((long)src + (srcSize - 8));
  local_a8 = (int *)src;
  if (piVar16 < piVar17) {
    uVar10 = ((int)pBVar6 - (int)piVar5) + uVar2;
    ilimit_w = iEnd + -8;
    do {
      local_b8 = (int *)((long)piVar16 + 1);
      uVar11 = (((int)piVar16 - (int)pBVar3) - uVar12) + 1;
      piVar15 = (int *)(pBVar3 + uVar11);
      if (uVar11 < uVar2) {
        piVar15 = (int *)(pBVar6 + (uVar11 - uVar10));
      }
      bVar9 = true;
      if ((uVar11 - uVar2 < 0xfffffffd) && (*piVar15 == *local_b8)) {
        mEnd = iEnd;
        if (uVar11 < uVar2) {
          mEnd = piVar5;
        }
        sVar13 = ZSTD_count_2segments
                           ((BYTE *)((long)piVar16 + 5),(BYTE *)(piVar15 + 1),(BYTE *)iEnd,
                            (BYTE *)mEnd,iStart);
        uVar22 = sVar13 + 4;
        bVar9 = false;
      }
      else {
        uVar22 = 0;
      }
      uVar14 = uVar22;
      if (bVar9) {
        local_50 = 999999999;
        uVar14 = ZSTD_HcFindBestMatch_dictMatchState_selectMLS
                           (local_38,(BYTE *)piVar16,(BYTE *)iEnd,&local_50);
        sVar13 = local_50;
        piVar15 = piVar16;
        if (uVar14 <= uVar22) {
          uVar14 = uVar22;
          sVar13 = 0;
          piVar15 = local_b8;
        }
        local_b8 = piVar15;
        if (3 < uVar14) {
          if (sVar13 == 0) goto LAB_0014322a;
          pBVar19 = (BYTE *)((long)local_b8 + (-(long)pBVar3 - sVar13) + -0xfffffffe);
          pBVar21 = pBVar3;
          pBVar18 = iStart;
          if ((uint)pBVar19 < uVar2) {
            pBVar21 = pBVar6 + -(ulong)uVar10;
            pBVar18 = local_40;
          }
          if ((local_a8 < local_b8) &&
             (uVar22 = (ulong)pBVar19 & 0xffffffff, pBVar18 < pBVar21 + uVar22)) {
            pBVar21 = pBVar21 + uVar22;
            do {
              pBVar21 = pBVar21 + -1;
              piVar16 = (int *)((long)local_b8 + -1);
              if ((*(BYTE *)piVar16 != *pBVar21) ||
                 (uVar14 = uVar14 + 1, local_b8 = piVar16, piVar16 <= local_a8)) break;
            } while (pBVar18 < pBVar21);
          }
          local_9c = (int)sVar13 + 1;
          uVar11 = (int)sVar13 - 2;
          uVar23 = uVar12;
          goto LAB_0014330a;
        }
        piVar16 = (int *)((long)piVar16 + ((long)piVar16 - (long)local_a8 >> 8) + 1);
      }
      else {
LAB_0014322a:
        local_9c = 1;
        uVar11 = uVar12;
LAB_0014330a:
        if (seqStore->maxNbSeq <=
            (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)) {
LAB_00143608:
          __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x2038,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (0x20000 < seqStore->maxNbLit) {
LAB_00143627:
          __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x203a,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        uVar22 = (long)local_b8 - (long)local_a8;
        pBVar18 = seqStore->lit;
        if (seqStore->litStart + seqStore->maxNbLit < pBVar18 + uVar22) {
LAB_00143665:
          __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x203b,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (iEnd < local_b8) {
LAB_00143646:
          __assert_fail("literals + litLength <= litLimit",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x203c,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (ilimit_w < local_b8) {
          ZSTD_safecopyLiterals(pBVar18,(BYTE *)local_a8,(BYTE *)local_b8,(BYTE *)ilimit_w);
        }
        else {
          uVar8 = *(undefined8 *)(local_a8 + 2);
          *(undefined8 *)pBVar18 = *(undefined8 *)local_a8;
          *(undefined8 *)(pBVar18 + 8) = uVar8;
          if (0x10 < uVar22) {
            pBVar21 = seqStore->lit;
            pBVar18 = pBVar21 + 0x10;
            piVar16 = local_a8 + 4;
            if ((BYTE *)0xffffffffffffffe8 < pBVar18 + (-8 - (long)piVar16)) {
              __assert_fail("diff >= 8 || (ovtype == ZSTD_no_overlap && diff <= -WILDCOPY_VECLEN)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x1268,
                            "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                           );
            }
            if ((BYTE *)0xffffffffffffffe0 < pBVar18 + (-0x10 - (long)piVar16)) {
              __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x1270,
                            "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                           );
            }
            uVar8 = *(undefined8 *)(local_a8 + 6);
            *(undefined8 *)pBVar18 = *(undefined8 *)piVar16;
            *(undefined8 *)(pBVar21 + 0x18) = uVar8;
            if (0x20 < (long)uVar22) {
              lVar20 = 0;
              do {
                puVar1 = (undefined8 *)((long)local_a8 + lVar20 + 0x20);
                uVar8 = puVar1[1];
                pBVar18 = pBVar21 + lVar20 + 0x20;
                *(undefined8 *)pBVar18 = *puVar1;
                *(undefined8 *)(pBVar18 + 8) = uVar8;
                puVar1 = (undefined8 *)((long)local_a8 + lVar20 + 0x30);
                uVar8 = puVar1[1];
                *(undefined8 *)(pBVar18 + 0x10) = *puVar1;
                *(undefined8 *)(pBVar18 + 0x18) = uVar8;
                lVar20 = lVar20 + 0x20;
              } while (pBVar18 + 0x20 < pBVar21 + uVar22);
            }
          }
        }
        seqStore->lit = seqStore->lit + uVar22;
        if (0xffff < uVar22) {
          if (seqStore->longLengthID != 0) {
            __assert_fail("seqStorePtr->longLengthID == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x204d,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          seqStore->longLengthID = 1;
          seqStore->longLengthPos =
               (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
        }
        psVar7 = seqStore->sequences;
        psVar7->litLength = (U16)uVar22;
        psVar7->offset = local_9c;
        if (0xffff < uVar14 - 3) {
          if (seqStore->longLengthID != 0) {
LAB_00143684:
            __assert_fail("seqStorePtr->longLengthID == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x2058,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          seqStore->longLengthID = 2;
          seqStore->longLengthPos =
               (U32)((ulong)((long)psVar7 - (long)seqStore->sequencesStart) >> 3);
        }
        psVar7->matchLength = (U16)(uVar14 - 3);
        seqStore->sequences = psVar7 + 1;
        piVar16 = (int *)((long)local_b8 + uVar14);
        local_a8 = piVar16;
        do {
          uVar12 = uVar11;
          if (piVar17 < piVar16) break;
          uVar12 = ((int)piVar16 - (int)pBVar3) - uVar23;
          pBVar18 = pBVar3;
          if (uVar12 < uVar2) {
            pBVar18 = pBVar6 + -(ulong)uVar10;
          }
          if ((uVar12 - uVar2 < 0xfffffffd) && (*(int *)(pBVar18 + uVar12) == *piVar16)) {
            piVar15 = iEnd;
            if (uVar12 < uVar2) {
              piVar15 = piVar5;
            }
            sVar13 = ZSTD_count_2segments
                               ((BYTE *)(piVar16 + 1),(BYTE *)((long)(pBVar18 + uVar12) + 4),
                                (BYTE *)iEnd,(BYTE *)piVar15,iStart);
            if (seqStore->maxNbSeq <=
                (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
            goto LAB_00143608;
            if (0x20000 < seqStore->maxNbLit) goto LAB_00143627;
            pBVar18 = seqStore->lit;
            if (seqStore->litStart + seqStore->maxNbLit < pBVar18) goto LAB_00143665;
            if (iEnd < local_a8) goto LAB_00143646;
            if (ilimit_w < local_a8) {
              ZSTD_safecopyLiterals(pBVar18,(BYTE *)local_a8,(BYTE *)local_a8,(BYTE *)ilimit_w);
            }
            else {
              uVar8 = *(undefined8 *)(local_a8 + 2);
              *(undefined8 *)pBVar18 = *(undefined8 *)local_a8;
              *(undefined8 *)(pBVar18 + 8) = uVar8;
            }
            psVar7 = seqStore->sequences;
            psVar7->litLength = 0;
            psVar7->offset = 1;
            if (0xffff < sVar13 + 1) {
              if (seqStore->longLengthID != 0) goto LAB_00143684;
              seqStore->longLengthID = 2;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)psVar7 - (long)seqStore->sequencesStart) >> 3);
            }
            psVar7->matchLength = (U16)(sVar13 + 1);
            seqStore->sequences = psVar7 + 1;
            piVar16 = (int *)((long)piVar16 + sVar13 + 4);
            bVar9 = true;
            uVar12 = uVar11;
            uVar11 = uVar23;
            local_a8 = piVar16;
          }
          else {
            bVar9 = false;
            uVar12 = uVar23;
          }
          uVar23 = uVar12;
          uVar12 = uVar11;
        } while (bVar9);
      }
    } while (piVar16 < piVar17);
  }
  *local_48 = uVar12;
  local_48[1] = uVar23;
  return (long)iEnd - (long)local_a8;
}

Assistant:

size_t ZSTD_compressBlock_greedy_dictMatchState(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    return ZSTD_compressBlock_lazy_generic(ms, seqStore, rep, src, srcSize, search_hashChain, 0, ZSTD_dictMatchState);
}